

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_decoding.h
# Opt level: O3

bool draco::anon_unknown_13::DecodeVarintUnsigned<unsigned_int>
               (int depth,uint *out_val,DecoderBuffer *buffer)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  
  if (5 < (uint)depth) {
    return false;
  }
  lVar1 = buffer->pos_ + 1;
  if (lVar1 <= buffer->data_size_) {
    bVar2 = buffer->data_[buffer->pos_];
    uVar4 = (uint)bVar2;
    buffer->pos_ = lVar1;
    if ((char)bVar2 < '\0') {
      bVar3 = DecodeVarintUnsigned<unsigned_int>(depth + 1,out_val,buffer);
      if (!bVar3) {
        return false;
      }
      uVar4 = bVar2 & 0x7f | *out_val << 7;
    }
    *out_val = uVar4;
    return true;
  }
  return false;
}

Assistant:

bool DecodeVarintUnsigned(int depth, IntTypeT *out_val, DecoderBuffer *buffer) {
  constexpr IntTypeT max_depth = sizeof(IntTypeT) + 1 + (sizeof(IntTypeT) >> 3);
  if (depth > max_depth) {
    return false;
  }
  // Coding of unsigned values.
  // 0-6 bit - data
  // 7 bit - next byte?
  uint8_t in;
  if (!buffer->Decode(&in)) {
    return false;
  }
  if (in & (1 << 7)) {
    // Next byte is available, decode it first.
    if (!DecodeVarintUnsigned<IntTypeT>(depth + 1, out_val, buffer)) {
      return false;
    }
    // Append decoded info from this byte.
    *out_val <<= 7;
    *out_val |= in & ((1 << 7) - 1);
  } else {
    // Last byte reached
    *out_val = in;
  }
  return true;
}